

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O3

pair<unsigned_int,_const_char_*> parse_char(char *src)

{
  byte bVar1;
  pair<unsigned_int,_const_char_*> pVar2;
  pair<unsigned_int,_const_char_*> pVar3;
  pair<unsigned_int,_const_char_*> pVar4;
  ulong uVar5;
  runtime_error *prVar6;
  long *plVar7;
  long *plVar8;
  byte *pbVar9;
  int size;
  pair<unsigned_int,_const_char_*> pVar10;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  bVar1 = *src;
  if (bVar1 != 0x5c) {
    if (bVar1 == 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"unexpected end of input");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar5 = CONCAT44(0,~(-1 << (8U - (char)*(int *)(decode_utf8(char_const*)::lookup +
                                                   (ulong)(bVar1 >> 4) * 4) & 0x1f)) & (uint)bVar1);
    pbVar9 = (byte *)(src + 1);
    pVar10.second = (char *)pbVar9;
    pVar10._0_8_ = uVar5;
    if ((~(bVar1 >> 4) & 0xc) != 0) {
      return pVar10;
    }
    do {
      pVar2.second = (char *)pbVar9;
      pVar2._0_8_ = uVar5;
      if (*pbVar9 == 0) {
        return pVar2;
      }
      uVar5 = CONCAT44(0,(int)uVar5 << 6 | *pbVar9 & 0x3f);
      pbVar9 = pbVar9 + 1;
      pVar3.second = (char *)pbVar9;
      pVar3._0_8_ = uVar5;
    } while (pbVar9 < src + *(int *)(decode_utf8(char_const*)::lookup + (ulong)(bVar1 >> 4) * 4));
    return pVar3;
  }
  bVar1 = src[1];
  uVar5 = (ulong)bVar1;
  if (bVar1 < 0x6e) {
    if ((2 < bVar1 - 0x5b) && (bVar1 != 0x22)) {
      if (bVar1 == 0x55) {
        size = 8;
        goto LAB_00195ac4;
      }
      goto switchD_00195a7e_caseD_6f;
    }
    goto LAB_00195ab3;
  }
  switch(bVar1) {
  case 0x6e:
    uVar5 = 10;
    break;
  default:
switchD_00195a7e_caseD_6f:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"unknown escape at ","");
    plVar7 = (long *)std::__cxx11::string::append((char *)local_68);
    local_48 = (long *)*plVar7;
    plVar8 = plVar7 + 2;
    if (local_48 == plVar8) {
      local_38 = *plVar8;
      lStack_30 = plVar7[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar8;
    }
    local_40 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)&local_48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 0x72:
    uVar5 = 0xd;
    break;
  case 0x74:
    uVar5 = 9;
    break;
  case 0x75:
    size = 4;
    goto LAB_00195ac4;
  case 0x78:
    size = 2;
LAB_00195ac4:
    pVar10 = parse_hex(src + 2,size);
    return pVar10;
  }
LAB_00195ab3:
  pVar4.second = src + 2;
  pVar4._0_8_ = uVar5;
  return pVar4;
}

Assistant:

static std::pair<uint32_t, const char *> parse_char(const char * src) {
    if (*src == '\\') {
        switch (src[1]) {
            case 'x': return parse_hex(src + 2, 2);
            case 'u': return parse_hex(src + 2, 4);
            case 'U': return parse_hex(src + 2, 8);
            case 't': return std::make_pair('\t', src + 2);
            case 'r': return std::make_pair('\r', src + 2);
            case 'n': return std::make_pair('\n', src + 2);
            case '\\':
            case '"':
            case '[':
            case ']':
                      return std::make_pair(src[1], src + 2);
            default:
                      throw std::runtime_error(std::string("unknown escape at ") + src);
        }
    } else if (*src) {
        return decode_utf8(src);
    }
    throw std::runtime_error("unexpected end of input");
}